

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateHeader(ValidationContext *this)

{
  ktx_uint32_t *args_1;
  ktx_uint32_t *pkVar1;
  ktx_uint32_t *pkVar2;
  ktx_uint32_t *args_1_00;
  VkFormat format;
  uint uVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  ktx_uint32_t kVar7;
  ktx_uint32_t kVar8;
  int extraout_EAX;
  uint32_t uVar9;
  VkFormat format_00;
  VkFormat VVar10;
  VkFormat extraout_EDX;
  VkFormat format_01;
  ktxSupercmpScheme extraout_EDX_00;
  ktxSupercmpScheme kVar11;
  ktxSupercmpScheme extraout_EDX_01;
  ktxSupercmpScheme extraout_EDX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  bool bVar13;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  uint32_t fullMipPyramidLevelCount;
  uint max_dim;
  ktx_uint32_t *local_48;
  uint local_3c;
  ktx_uint32_t *local_38;
  
  (*this->_vptr_ValidationContext[2])(this,0,&this->header,0x50,10,"the header");
  format = (this->header).vkFormat;
  uVar3 = (this->header).supercompressionScheme;
  iVar6 = bcmp(&this->header,validateHeader::ktx2_identifier_reference,0xc);
  if (iVar6 != 0) {
    fatal<>(this,&FileError::NotKTX2);
  }
  cVar5 = isProhibitedFormat((ktx *)(ulong)format);
  if (cVar5 == '\0') {
    bVar13 = isFormatValid(format);
    uVar12 = extraout_RDX_00;
    if (!bVar13) {
      if ((int)format < 0xb9) {
        toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,
                            (VkFormat)extraout_RDX_00);
        error<std::__cxx11::string>
                  (this,&HeaderData::InvalidFormat,(string *)&fullMipPyramidLevelCount);
      }
      else if (format + ~VK_FORMAT_ASTC_12x12_SRGB_BLOCK < 0x3b9acd2f) {
        toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,
                            (VkFormat)extraout_RDX_00);
        error<std::__cxx11::string>
                  (this,&HeaderData::InvalidFormat,(string *)&fullMipPyramidLevelCount);
      }
      else {
        bVar13 = isFormatKnown(format);
        uVar12 = extraout_RDX_08;
        if (bVar13) goto LAB_00188200;
        toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,
                            (VkFormat)extraout_RDX_08);
        warning<std::__cxx11::string>
                  (this,&HeaderData::UnknownFormat,(string *)&fullMipPyramidLevelCount);
      }
      goto LAB_001881e4;
    }
  }
  else {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,format_00);
    error<std::__cxx11::string>
              (this,&HeaderData::ProhibitedFormat,(string *)&fullMipPyramidLevelCount);
LAB_001881e4:
    std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    uVar12 = extraout_RDX;
  }
LAB_00188200:
  kVar8 = (this->header).vkFormat;
  bVar13 = (this->header).supercompressionScheme != 1;
  VVar10 = (VkFormat)CONCAT71((int7)((ulong)uVar12 >> 8),kVar8 == 0 || bVar13);
  if (kVar8 != 0 && !bVar13) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,VVar10);
    error<std::__cxx11::string>
              (this,&HeaderData::VkFormatAndBasis,(string *)&fullMipPyramidLevelCount);
    std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    kVar8 = (this->header).vkFormat;
    VVar10 = extraout_EDX;
  }
  if (kVar8 == 0) {
    if ((this->header).typeSize != 1) {
      toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,VVar10);
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,
                 (string *)&fullMipPyramidLevelCount);
      goto LAB_001882b2;
    }
  }
  else {
    bVar13 = isFormatBlockCompressed(format);
    if ((bVar13) && ((this->header).typeSize != 1)) {
      toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,format_01);
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,
                 (string *)&fullMipPyramidLevelCount);
LAB_001882b2:
      std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    }
  }
  if ((this->header).pixelWidth == 0) {
    error<>(this,&HeaderData::WidthZero);
  }
  bVar13 = isFormatBlockCompressed(format);
  args_1 = &(this->header).pixelHeight;
  kVar8 = (this->header).pixelHeight;
  uVar12 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),kVar8 == 0 && bVar13);
  if (kVar8 == 0 && bVar13) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,(VkFormat)uVar12);
    error<std::__cxx11::string>
              (this,&HeaderData::BlockCompressedNoHeight,(string *)&fullMipPyramidLevelCount);
    std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    kVar8 = *args_1;
    uVar12 = extraout_RDX_02;
  }
  local_3c = uVar3;
  if ((uVar3 ^ 1) == 0 && kVar8 == 0) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)0x1,(ktxSupercmpScheme)uVar12);
    error<std::__cxx11::string>
              (this,&HeaderData::BlockCompressedNoHeight,(string *)&fullMipPyramidLevelCount);
    std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    kVar8 = *args_1;
    uVar12 = extraout_RDX_03;
  }
  pkVar1 = &(this->header).pixelWidth;
  if (((this->header).faceCount == 6) && ((this->header).pixelWidth != kVar8)) {
    error<unsigned_int&,unsigned_int&>(this,&HeaderData::CubeHeightWidthMismatch,pkVar1,args_1);
    kVar8 = (this->header).pixelHeight;
    uVar12 = extraout_RDX_04;
  }
  pkVar2 = &(this->header).pixelDepth;
  kVar7 = (this->header).pixelDepth;
  local_38 = pkVar1;
  if ((kVar7 != 0) && (kVar8 == 0)) {
    error<unsigned_int&>(this,&HeaderData::DepthNoHeight,pkVar2);
    kVar7 = (this->header).pixelDepth;
    uVar12 = extraout_RDX_05;
  }
  if ((format + 0xc460d100 < 0x1e) && (kVar7 == 0)) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,(VkFormat)uVar12);
    error<std::__cxx11::string>
              (this,&HeaderData::DepthBlockCompressedNoDepth,(string *)&fullMipPyramidLevelCount);
    std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    uVar12 = extraout_RDX_06;
  }
  VVar10 = (VkFormat)uVar12;
  if ((format - VK_FORMAT_D16_UNORM < 7) && (format - VK_FORMAT_D16_UNORM != 3)) {
    if (*pkVar2 == 0) {
      kVar8 = 0;
    }
    else {
LAB_00188400:
      toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,VVar10);
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::DepthStencilFormatWithDepth,pkVar2,
                 (string *)&fullMipPyramidLevelCount);
      std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
      kVar8 = *pkVar2;
    }
  }
  else {
    bVar13 = format - VK_FORMAT_BC1_RGB_UNORM_BLOCK < 0xfffffffc;
    kVar8 = *pkVar2;
    VVar10 = (VkFormat)CONCAT71((int7)((ulong)uVar12 >> 8),kVar8 == 0 || bVar13);
    if (kVar8 != 0 && !bVar13) goto LAB_00188400;
  }
  pkVar1 = &(this->header).faceCount;
  if (kVar8 != 0 && *pkVar1 == 6) {
    error<unsigned_int&>(this,&HeaderData::CubeWithDepth,pkVar2);
    kVar8 = (this->header).pixelDepth;
  }
  if (kVar8 == 0) {
    if ((this->header).pixelHeight == 0) {
      this->dimensionCount = 1;
    }
    else {
      this->dimensionCount = 2;
    }
  }
  else {
    this->dimensionCount = 3;
    if ((this->header).layerCount != 0) {
      warning<>(this,&HeaderData::ThreeDArray);
    }
  }
  kVar8 = (this->header).layerCount;
  kVar7 = (this->header).faceCount;
  this->numLayers = kVar8 + (kVar8 == 0);
  if ((kVar7 != 1) && (kVar7 != 6)) {
    error<unsigned_int&>(this,&HeaderData::InvalidFaceCount,pkVar1);
  }
  bVar13 = isFormatBlockCompressed(format);
  local_48 = &(this->header).levelCount;
  kVar8 = (this->header).levelCount;
  kVar11 = (ktxSupercmpScheme)CONCAT71((int7)((ulong)extraout_RDX_07 >> 8),kVar8 == 0 && bVar13);
  __x = extraout_XMM0_Qa;
  if (kVar8 == 0 && bVar13) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)format,kVar11);
    error<std::__cxx11::string>
              (this,&HeaderData::BlockCompressedNoLevel,(string *)&fullMipPyramidLevelCount);
    __x = (double)std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    kVar8 = *local_48;
    kVar11 = extraout_EDX_00;
  }
  uVar4 = local_3c;
  if ((uVar3 ^ 1) == 0 && kVar8 == 0) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)0x1,kVar11);
    error<std::__cxx11::string>
              (this,&HeaderData::BlockCompressedNoLevel,(string *)&fullMipPyramidLevelCount);
    __x = (double)std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    kVar8 = *local_48;
  }
  uVar9 = kVar8 + (kVar8 == 0);
  this->numLevels = uVar9;
  uVar3 = (this->header).pixelWidth;
  max_dim = (this->header).pixelHeight;
  if (max_dim < uVar3) {
    max_dim = uVar3;
  }
  uVar3 = (this->header).pixelDepth;
  if (max_dim <= uVar3) {
    max_dim = uVar3;
  }
  kVar11 = max_dim >> ((char)uVar9 - 1U & 0x1f);
  if (kVar11 == KTX_SS_BEGIN_RANGE) {
    error<unsigned_int&,unsigned_int_const&>
              (this,&HeaderData::TooManyMipLevels,&this->numLevels,&max_dim);
    __x = extraout_XMM0_Qa_00;
    kVar11 = extraout_EDX_01;
  }
  uVar3 = (this->header).supercompressionScheme;
  if ((uVar3 & 0xffff0000) == 0x10000) {
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)uVar4,kVar11);
    warning<std::__cxx11::string>
              (this,&HeaderData::VendorSupercompression,(string *)&fullMipPyramidLevelCount);
  }
  else {
    if (uVar3 < 4) goto LAB_00188677;
    toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)uVar4,kVar11);
    error<std::__cxx11::string>
              (this,&HeaderData::InvalidSupercompression,(string *)&fullMipPyramidLevelCount);
  }
  __x = (double)std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
  kVar11 = extraout_EDX_02;
LAB_00188677:
  if (this->checkGLTFBasisU == true) {
    if (2 < (this->header).supercompressionScheme) {
      toString_abi_cxx11_((string *)&fullMipPyramidLevelCount,(ktx *)(ulong)uVar4,kVar11);
      error<std::__cxx11::string>
                (this,&HeaderData::InvalidSupercompressionGLTFBU,(string *)&fullMipPyramidLevelCount
                );
      __x = (double)std::__cxx11::string::~string((string *)&fullMipPyramidLevelCount);
    }
    args_1_00 = &(this->header).layerCount;
    if (*pkVar2 != 0) {
      fullMipPyramidLevelCount = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1cddd7,pkVar2,
                 (int *)&fullMipPyramidLevelCount);
      __x = extraout_XMM0_Qa_01;
    }
    if (*args_1_00 != 0) {
      fullMipPyramidLevelCount = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1cddea,args_1_00,
                 (int *)&fullMipPyramidLevelCount);
      __x = extraout_XMM0_Qa_02;
    }
    pkVar2 = local_38;
    if (*pkVar1 != 1) {
      fullMipPyramidLevelCount = 1;
      error<char_const(&)[10],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [10])0x1cddfd,pkVar1,
                 (int *)&fullMipPyramidLevelCount);
      __x = extraout_XMM0_Qa_03;
    }
    if ((*pkVar2 & 3) != 0) {
      error<char_const(&)[11],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [11])0x1cddb0,pkVar2);
      __x = extraout_XMM0_Qa_04;
    }
    if ((*args_1 & 3) != 0) {
      error<char_const(&)[12],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [12])0x1cddc3,args_1);
      __x = extraout_XMM0_Qa_05;
    }
    log2(__x);
    fullMipPyramidLevelCount = extraout_EAX + 1;
    if (*local_48 != fullMipPyramidLevelCount && *local_48 != 1) {
      error<unsigned_int&,unsigned_int&>
                (this,&HeaderData::InvalidLevelCountGLTFBU,local_48,&fullMipPyramidLevelCount);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateHeader() {
    static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;

    read(0, &header, sizeof(KTX_header2), "the header");
    const auto vkFormat = VkFormat(header.vkFormat);
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate file identifier
    if (std::memcmp(&header.identifier, ktx2_identifier_reference, 12) != 0)
        fatal(FileError::NotKTX2);

    // Validate vkFormat
    if (isProhibitedFormat(vkFormat)) {
        error(HeaderData::ProhibitedFormat, toString(vkFormat));

    } else if (!isFormatValid(vkFormat)) {
        if (vkFormat <= VK_FORMAT_MAX_STANDARD_ENUM)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (VK_FORMAT_MAX_STANDARD_ENUM < vkFormat && vkFormat < 1000001000)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (1000001000 <= vkFormat && !isFormatKnown(vkFormat))
            warning(HeaderData::UnknownFormat, toString(vkFormat));
    }

    if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (header.vkFormat != VK_FORMAT_UNDEFINED)
            error(HeaderData::VkFormatAndBasis, toString(vkFormat));
    }

    // Validate typeSize
    if (header.vkFormat == VK_FORMAT_UNDEFINED) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));

    } else if (isFormatBlockCompressed(vkFormat)) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));
    }
    // Additional checks are performed on typeSize after the DFD is parsed

    // Validate image dimensions
    if (header.pixelWidth == 0)
        error(HeaderData::WidthZero);

    if (isFormatBlockCompressed(vkFormat))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate pixelHeight

    if (header.faceCount == 6)
        if (header.pixelWidth != header.pixelHeight)
            error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0 && header.pixelHeight == 0)
        error(HeaderData::DepthNoHeight, header.pixelDepth);

    if (isFormat3DBlockCompressed(vkFormat))
        if (header.pixelDepth == 0)
            error(HeaderData::DepthBlockCompressedNoDepth, toString(vkFormat));

    if (isFormatDepth(vkFormat) || isFormatStencil(vkFormat))
        if (header.pixelDepth != 0)
            error(HeaderData::DepthStencilFormatWithDepth, header.pixelDepth, toString(vkFormat));

    if (header.faceCount == 6)
        if (header.pixelDepth != 0)
            error(HeaderData::CubeWithDepth, header.pixelDepth);

    // Detect dimension counts
    if (header.pixelDepth != 0) {
        dimensionCount = 3;
        if (header.layerCount != 0)
            warning(HeaderData::ThreeDArray); // Warning on 3D Array textures
    } else if (header.pixelHeight != 0) {
        dimensionCount = 2;
    } else {
        dimensionCount = 1;
    }

    // Validate layerCount to actual number of layers.
    numLayers = std::max(header.layerCount, 1u);

    // Validate faceCount
    if (header.faceCount != 6 && header.faceCount != 1)
        error(HeaderData::InvalidFaceCount, header.faceCount);

    // 2D Cube map faces were validated by CubeHeightWidthMismatch and CubeWithDepth

    // Validate levelCount
    if (isFormatBlockCompressed(vkFormat))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate levelCount

    numLevels = std::max(header.levelCount, 1u);

    // This test works for arrays too because height or depth will be 0.
    const auto max_dim = std::max(std::max(header.pixelWidth, header.pixelHeight), header.pixelDepth);
    if (max_dim < (1u << (numLevels - 1u))) {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        error(HeaderData::TooManyMipLevels, numLevels, max_dim);
    }

    // Validate supercompressionScheme
    if (KTX_SS_BEGIN_VENDOR_RANGE <= header.supercompressionScheme && header.supercompressionScheme <= KTX_SS_END_VENDOR_RANGE)
        warning(HeaderData::VendorSupercompression, toString(supercompressionScheme));
    else if (header.supercompressionScheme < KTX_SS_BEGIN_RANGE || KTX_SS_END_RANGE < header.supercompressionScheme)
        error(HeaderData::InvalidSupercompression, toString(supercompressionScheme));

    // Validate GLTF KHR_texture_basisu compatibility, if needed
    if (checkGLTFBasisU) {
        // Check for allowed supercompression schemes
        switch (header.supercompressionScheme) {
        case KTX_SS_NONE: [[fallthrough]];
        case KTX_SS_BASIS_LZ: [[fallthrough]];
        case KTX_SS_ZSTD:
            break;
        default:
            error(HeaderData::InvalidSupercompressionGLTFBU, toString(supercompressionScheme));
            break;
        }

        // Check that texture type is 2D
        // NOTE: pixelHeight == 0 already covered by other error codes
        if (header.pixelDepth != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "pixelDepth", header.pixelDepth, 0);
        if (header.layerCount != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "layerCount", header.layerCount, 0);
        if (header.faceCount != 1)
            error(HeaderData::InvalidTextureTypeGLTFBU, "faceCount", header.faceCount, 1);

        // Check that width and height are multiples of 4
        if (header.pixelWidth % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelWidth", header.pixelWidth);
        if (header.pixelHeight % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelHeight", header.pixelHeight);

        // Check that levelCount is 1 or that the full mip pyramid is present
        uint32_t fullMipPyramidLevelCount = 1 + (uint32_t)log2(max_dim);
        if (header.levelCount != 1 && header.levelCount != fullMipPyramidLevelCount)
            error(HeaderData::InvalidLevelCountGLTFBU, header.levelCount, fullMipPyramidLevelCount);
    }
}